

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc64.cpp
# Opt level: O0

void __thiscall Crc64::DisplayTable(Crc64 *this)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  int local_1c;
  int local_18;
  int j;
  int i;
  int index;
  Crc64 *this_local;
  
  j = 0;
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"0x");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::uppercase);
      uVar4 = std::ostream::operator<<(poVar3,std::hex);
      _Var1 = std::setfill<char>('0');
      poVar3 = std::operator<<(uVar4,_Var1._M_c);
      _Var2 = std::setw(0x10);
      poVar3 = std::operator<<(poVar3,_Var2);
      pvVar5 = std::array<unsigned_long,_256UL>::operator[](&this->crcTable,(long)j);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
      std::operator<<(poVar3,", ");
      j = j + 1;
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  return;
}

Assistant:

void Crc64::DisplayTable() const
{
  int index = 0;

  for (int i = 0; i < 16; ++i)
  {
    for (int j = 0; j < 16; ++j)
    {
      std::cout << "0x" << std::uppercase << std::hex << std::setfill('0') << std::setw(16) << crcTable[index++] << ", ";
    }

    std::cout << "\n";
  }
}